

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

void __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::draw
          (SparseTextureClampLookupResidencyTestCase *this,GLint target,GLint layer,
          ShaderProgram *program)

{
  long lVar1;
  long *plVar2;
  GLuint indices [6];
  GLfloat texCoord1D [4];
  GLfloat texCoord2D [8];
  GLfloat vertices [12];
  GLfloat texCoord3D [12];
  GLfloat texCoordCubeMap [6] [12];
  long *local_358;
  long local_350;
  long local_348 [2];
  undefined1 *local_338;
  long *local_330;
  undefined8 *local_328;
  long local_320 [2];
  int local_310;
  undefined1 local_308 [8];
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  int local_2e0;
  VertexArrayPointer local_2d8;
  Type local_2b8;
  long *local_2b0 [2];
  long local_2a0 [2];
  int local_290;
  VertexArrayPointer local_288;
  SparseTextureClampLookupResidencyTestCase *local_268;
  ShaderProgram *local_260;
  Type local_258;
  undefined1 *local_250;
  long local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  int local_230;
  VertexArrayPointer local_228;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158 [37];
  
  local_1e8 = 0x3f80000000000000;
  uStack_1e0 = 0x3f80000000000000;
  local_1c8 = 0x3f80000000000000;
  uStack_1c0 = 0x3f8000003f800000;
  local_1d8 = 0;
  uStack_1d0 = 0x3f800000;
  local_168 = 0x3f8000003f000000;
  uStack_160 = 0x3f0000003f800000;
  local_178 = 0x3f00000000000000;
  uStack_170 = 0x3f80000000000000;
  local_188 = 0;
  uStack_180 = 0x3f8000003f000000;
  memcpy(local_158,&DAT_01ab79f0,0x120);
  local_198 = 0x3f80000000000000;
  uStack_190 = 0x3f800000;
  local_1a8 = 0xbf800000;
  uStack_1a0 = 0x3f800000bf800000;
  local_1b8 = 0xbf800000bf800000;
  uStack_1b0 = 0x3f80000000000000;
  local_208 = 0x100000000;
  uStack_200 = 0x100000002;
  local_1f8 = 0x300000002;
  local_258 = 2;
  local_250 = &local_240;
  local_248 = 0;
  local_240 = 0;
  local_230 = 0;
  local_228.componentType = VTX_COMP_TYPE_LAST;
  local_228.convert = VTX_COMP_CONVERT_LAST;
  local_228.numComponents = 0;
  local_228.numElements = 0;
  local_228._16_8_ = (ulong)(uint)local_228._20_4_ << 0x20;
  local_228.data = (void *)0x0;
  local_268 = this;
  local_260 = program;
  if (target < 0x8513) {
    if (target == 0xde0) {
LAB_00a70b4b:
      local_358 = local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"inCoord","");
      local_338 = (undefined1 *)CONCAT44(local_338._4_4_,PRIMITIVETYPE_TRIANGLE_STRIP);
      local_330 = local_320;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_330,local_358,local_350 + (long)local_358);
      local_310 = 0;
      local_308._0_4_ = (Type)local_338;
      local_300._M_p = (pointer)&local_2f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,local_330,(long)local_328 + (long)local_330);
      local_2e0 = local_310;
      local_2d8.componentType = VTX_COMP_FLOAT;
      local_2d8.convert = VTX_COMP_CONVERT_NONE;
      local_2d8.numComponents = 1;
      local_2d8.numElements = 4;
      local_2d8.stride = 0;
      local_2d8.data = &local_1e8;
      if (local_330 != local_320) {
        operator_delete(local_330,local_320[0] + 1);
      }
      local_258 = local_308._0_4_;
      std::__cxx11::string::operator=((string *)&local_250,(string *)&local_300);
      local_230 = local_2e0;
      local_228._16_8_ = CONCAT44(local_2d8._20_4_,local_2d8.stride);
      local_228.data = local_2d8.data;
      local_228.componentType = local_2d8.componentType;
      local_228.convert = local_2d8.convert;
      local_228.numComponents = local_2d8.numComponents;
      local_228.numElements = local_2d8.numElements;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_p != &local_2f0) {
        operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
      }
      if (local_358 != local_348) {
        operator_delete(local_358,local_348[0] + 1);
      }
      goto LAB_00a70e4a;
    }
    if (target == 0x806f) {
      local_358 = local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"inCoord","");
      local_338 = (undefined1 *)CONCAT44(local_338._4_4_,PRIMITIVETYPE_TRIANGLE_STRIP);
      local_330 = local_320;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_330,local_358,local_350 + (long)local_358);
      local_310 = 0;
      local_308._0_4_ = (Type)local_338;
      local_300._M_p = (pointer)&local_2f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,local_330,(long)local_328 + (long)local_330);
      local_2e0 = local_310;
      local_2d8.numComponents = 3;
      local_2d8.numElements = 4;
      local_2d8.data = &local_188;
    }
    else {
LAB_00a70c75:
      local_358 = local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"inCoord","");
      local_338 = (undefined1 *)CONCAT44(local_338._4_4_,PRIMITIVETYPE_TRIANGLE_STRIP);
      local_330 = local_320;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_330,local_358,local_350 + (long)local_358);
      local_310 = 0;
      local_308._0_4_ = (Type)local_338;
      local_300._M_p = (pointer)&local_2f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,local_330,(long)local_328 + (long)local_330);
      local_2e0 = local_310;
      local_2d8.numComponents = 2;
      local_2d8.numElements = 4;
      local_2d8.data = &local_1d8;
    }
  }
  else {
    if (target != 0x8513) {
      if (target != 0x8c18) goto LAB_00a70c75;
      goto LAB_00a70b4b;
    }
    local_358 = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"inCoord","");
    local_338 = (undefined1 *)CONCAT44(local_338._4_4_,PRIMITIVETYPE_TRIANGLE_STRIP);
    local_330 = local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_358,local_350 + (long)local_358);
    local_310 = 0;
    local_308._0_4_ = (Type)local_338;
    local_300._M_p = (pointer)&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,local_330,(long)local_328 + (long)local_330);
    local_2d8.data = local_158 + (long)layer * 6;
    local_2e0 = local_310;
    local_2d8.numComponents = 3;
    local_2d8.numElements = 4;
  }
  local_2d8.stride = 0;
  local_2d8.componentType = VTX_COMP_FLOAT;
  local_2d8.convert = VTX_COMP_CONVERT_NONE;
  local_310 = local_2e0;
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  local_258 = local_308._0_4_;
  std::__cxx11::string::operator=((string *)&local_250,(string *)&local_300);
  local_230 = local_2e0;
  local_228._16_8_ = CONCAT44(local_2d8._20_4_,local_2d8.stride);
  local_228.data = local_2d8.data;
  local_228.componentType = local_2d8.componentType;
  local_228.convert = local_2d8.convert;
  local_228.numComponents = local_2d8.numComponents;
  local_228.numElements = local_2d8.numElements;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_p != &local_2f0) {
    operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
  }
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
LAB_00a70e4a:
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"vertex","");
  local_338 = (undefined1 *)CONCAT44(local_338._4_4_,PRIMITIVETYPE_TRIANGLE_STRIP);
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,local_358,local_350 + (long)local_358);
  local_310 = 0;
  local_308._0_4_ = (Type)local_338;
  local_300._M_p = (pointer)&local_2f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,local_330,(long)local_328 + (long)local_330);
  local_2e0 = local_310;
  local_2d8.componentType = VTX_COMP_FLOAT;
  local_2d8.convert = VTX_COMP_CONVERT_NONE;
  local_2d8.numComponents = 3;
  local_2d8.numElements = 4;
  local_2d8.stride = 0;
  local_2d8.data = &local_1b8;
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  local_2b8 = local_258;
  plVar2 = local_2a0;
  local_2b0[0] = plVar2;
  std::__cxx11::string::_M_construct<char*>((string *)local_2b0,local_250,local_250 + local_248);
  local_290 = local_230;
  local_288.componentType = local_228.componentType;
  local_288.convert = local_228.convert;
  local_288.numComponents = local_228.numComponents;
  local_288.numElements = local_228.numElements;
  local_288.stride = local_228.stride;
  local_288._20_4_ = local_228._20_4_;
  local_288.data = local_228.data;
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  local_338 = &DAT_600000001;
  local_330 = (long *)CONCAT44(local_330._4_4_,INDEXTYPE_UINT32);
  local_328 = &local_208;
  glu::draw(((local_268->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
             super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_renderCtx,
            (local_260->m_program).m_program,2,(VertexArrayBinding *)local_308,
            (PrimitiveList *)&local_338,(DrawUtilCallback *)0x0);
  lVar1 = -0xa0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -10;
    lVar1 = lVar1 + 0x50;
  } while (lVar1 != 0);
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
  }
  return;
}

Assistant:

void SparseTextureClampLookupResidencyTestCase::draw(GLint target, GLint layer, const ShaderProgram& program)
{
	const GLfloat texCoord1D[] = { 0.0f, 1.0f, 0.0f, 1.0f };

	const GLfloat texCoord2D[] = {
		0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 1.0f, 1.0f, 1.0f,
	};

	const GLfloat texCoord3D[] = { 0.0f, 0.0f, 0.5f, 1.0f, 0.0f, 0.5f, 0.0f, 1.0f, 0.5f, 1.0f, 1.0f, 0.5f };

	const GLfloat texCoordCubeMap[6][12] = {
		{ 0.0f, 0.0f, 0.00f, 1.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f },
		{ 0.0f, 0.0f, 0.17f, 1.0f, 0.0f, 0.17f, 0.0f, 1.0f, 0.17f, 1.0f, 1.0f, 0.17f },
		{ 0.0f, 0.0f, 0.33f, 1.0f, 0.0f, 0.33f, 0.0f, 1.0f, 0.33f, 1.0f, 1.0f, 0.33f },
		{ 0.0f, 0.0f, 0.5f, 1.0f, 0.0f, 0.5f, 0.0f, 1.0f, 0.5f, 1.0f, 1.0f, 0.5f },
		{ 0.0f, 0.0f, 0.67f, 1.0f, 0.0f, 0.67f, 0.0f, 1.0f, 0.67f, 1.0f, 1.0f, 0.67f },
		{ 0.0f, 0.0f, 0.83f, 1.0f, 0.0f, 0.83f, 0.0f, 1.0f, 0.83f, 1.0f, 1.0f, 0.83f }
	};

	const GLfloat vertices[] = {
		-1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 0.0f, -1.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f,
	};

	const GLuint indices[] = { 0, 1, 2, 1, 2, 3 };

	VertexArrayBinding floatCoord;

	if (target == GL_TEXTURE_1D || target == GL_TEXTURE_1D_ARRAY)
		floatCoord = glu::va::Float("inCoord", 1, 4, 0, texCoord1D);
	else if (target == GL_TEXTURE_3D)
		floatCoord = glu::va::Float("inCoord", 3, 4, 0, texCoord3D);
	else if (target == GL_TEXTURE_CUBE_MAP)
		floatCoord = glu::va::Float("inCoord", 3, 4, 0, texCoordCubeMap[layer]);
	else
		floatCoord = glu::va::Float("inCoord", 2, 4, 0, texCoord2D);

	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("vertex", 3, 4, 0, vertices), floatCoord };

	glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indices), indices));
}